

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O2

void __thiscall deqp::gles3::Functional::TextureUnitCase::~TextureUnitCase(TextureUnitCase *this)

{
  ~TextureUnitCase(this);
  operator_delete(this,0x158);
  return;
}

Assistant:

TextureUnitCase::~TextureUnitCase (void)
{
	TextureUnitCase::deinit();
}